

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_space.cpp
# Opt level: O0

uint mylog2(size_t n)

{
  undefined4 local_14;
  size_t sStack_10;
  uint bits;
  size_t n_local;
  
  local_14 = 0;
  for (sStack_10 = n; 1 < sStack_10; sStack_10 = sStack_10 >> 1) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

static unsigned mylog2(size_t n)
{
	unsigned bits = 0;
	while (n > 1) {
		bits++;
		n >>= 1;
	}
	return bits;
}